

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_indexer_impl.h
# Opt level: O1

void node::fill_rld(vector<int,_std::allocator<int>_> *postr_to_rld,
                   vector<int,_std::allocator<int>_> *prel_to_size,
                   vector<int,_std::allocator<int>_> *postr_to_prel,
                   vector<int,_std::allocator<int>_> *prel_to_postr,
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *prel_to_children)

{
  int iVar1;
  int *piVar2;
  pointer piVar3;
  pointer pvVar4;
  pointer piVar5;
  pointer piVar6;
  long lVar7;
  
  piVar2 = (prel_to_size->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (0 < *piVar2) {
    piVar3 = (postr_to_prel->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pvVar4 = (prel_to_children->
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    piVar5 = (prel_to_postr->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (postr_to_rld->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = 0;
    do {
      iVar1 = piVar3[lVar7];
      if (piVar2[iVar1] == 1) {
        piVar6[lVar7] = (int)lVar7;
      }
      else {
        piVar6[lVar7] =
             piVar6[piVar5[(*(pointer *)
                             ((long)&pvVar4[iVar1].super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data + 8))[-1]]];
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < *piVar2);
  }
  return;
}

Assistant:

void fill_rld(std::vector<int>& postr_to_rld,
    const std::vector<int>& prel_to_size,
    const std::vector<int>& postr_to_prel,
    const std::vector<int>& prel_to_postr,
    const std::vector<std::vector<int>>& prel_to_children) {
  // The loop iterates over right-to-left postorder.
  int preorder = 0;
  for(int i = 0; i < prel_to_size[0]; ++i) {
    preorder = postr_to_prel[i];
    if (prel_to_size[preorder] == 1) {
      postr_to_rld[i] = i;
    } else {
      postr_to_rld[i] = postr_to_rld[prel_to_postr[prel_to_children[preorder][prel_to_children[preorder].size()-1]]];
    }
  }
}